

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O0

StrHash hash_dense_sse42(uint64_t seed,uint32_t h,char *str,MSize len)

{
  uint uVar1;
  uint uVar2;
  uint32_t b;
  MSize len_local;
  char *str_local;
  uint32_t h_local;
  uint64_t seed_local;
  
  uVar2 = (uint)(seed >> 0x20);
  uVar1 = (h ^ uVar2) << 4;
  seed_local._0_4_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
       (uVar1 | (h ^ uVar2) >> 0x1c) << 0x18;
  if (0x10 < len) {
    if (len < 0x80) {
      seed_local._0_4_ = hash_16_128((ulong)(uint32_t)seed_local,str,len);
    }
    else {
      seed_local._0_4_ = hash_128_above((ulong)(uint32_t)seed_local,str,len);
    }
  }
  return (uint32_t)seed_local;
}

Assistant:

static StrHash hash_dense_sse42(uint64_t seed, uint32_t h, const char* str,
				MSize len)
{
  uint32_t b = lj_bswap(lj_rol(h ^ (uint32_t)(seed >> 32), 4));

  if (len <= 16)
    return b;

  if (len < 128) /* [16, 128), try with a different seed. */
    return hash_16_128(b, str, len);

  /* Otherwise, do the slow crc32 randomization for long strings. */
  return hash_128_above(b, str, len);
}